

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_iterator.c
# Opt level: O0

void kcc_iterator_reset(kcc_iterator_nbx *b)

{
  kcc_joint *pkVar1;
  kcc_segment *pkVar2;
  gc_pose *pgVar3;
  undefined4 uVar4;
  int index;
  kcc_iterator_nbx *b_local;
  
  if (b == (kcc_iterator_nbx *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/example/chain_iterator.c"
                  ,9,"void kcc_iterator_reset(struct kcc_iterator_nbx *)");
  }
  if (b->current_index == (int *)0x0) {
    __assert_fail("b->current_index",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/example/chain_iterator.c"
                  ,10,"void kcc_iterator_reset(struct kcc_iterator_nbx *)");
  }
  if (b->next_index == (int *)0x0) {
    __assert_fail("b->next_index",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/example/chain_iterator.c"
                  ,0xb,"void kcc_iterator_reset(struct kcc_iterator_nbx *)");
  }
  if (b->joint != (kcc_joint *)0x0) {
    if (b->joint_type == (joint_type *)0x0) {
      __assert_fail("b->joint_type",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/example/chain_iterator.c"
                    ,0xd,"void kcc_iterator_reset(struct kcc_iterator_nbx *)");
    }
    if (b->x_link != (gc_pose *)0x0) {
      if (b->has_next != (_Bool *)0x0) {
        *b->current_index = 0;
        *b->next_index = 1;
        pkVar1 = b->joint;
        pkVar2 = b->chain->segment;
        uVar4 = *(undefined4 *)&(pkVar2->joint).field_0x4;
        pkVar1->type = (pkVar2->joint).type;
        *(undefined4 *)&pkVar1->field_0x4 = uVar4;
        *(undefined8 *)&pkVar1->field_1 = *(undefined8 *)&(pkVar2->joint).field_1;
        (pkVar1->field_1).revolute_joint.inertia = (pkVar2->joint).field_1.revolute_joint.inertia;
        *b->joint_type = (b->chain->segment->joint).type;
        pgVar3 = b->x_link;
        pkVar2 = b->chain->segment;
        pgVar3->rotation = (pkVar2->joint_attachment).rotation;
        pgVar3->translation = (pkVar2->joint_attachment).translation;
        *b->has_next = 0 < b->chain->number_of_segments;
        return;
      }
      __assert_fail("b->has_next",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/example/chain_iterator.c"
                    ,0xf,"void kcc_iterator_reset(struct kcc_iterator_nbx *)");
    }
    __assert_fail("b->x_link",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/example/chain_iterator.c"
                  ,0xe,"void kcc_iterator_reset(struct kcc_iterator_nbx *)");
  }
  __assert_fail("b->joint",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/example/chain_iterator.c"
                ,0xc,"void kcc_iterator_reset(struct kcc_iterator_nbx *)");
}

Assistant:

void kcc_iterator_reset(
        struct kcc_iterator_nbx *b)
{
    assert(b);
    assert(b->current_index);
    assert(b->next_index);
    assert(b->joint);
    assert(b->joint_type);
    assert(b->x_link);
    assert(b->has_next);

    int index = 0;

    *b->current_index = index;
    *b->next_index = index + 1;
    *b->joint = b->chain->segment[index].joint;
    *b->joint_type = b->chain->segment[index].joint.type;
    *b->x_link = b->chain->segment[index].joint_attachment;
    *b->has_next = (index < b->chain->number_of_segments);
}